

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# os.h
# Opt level: O0

tm * __thiscall spdlog::details::os::localtime(os *this,time_t *__timer)

{
  time_t *time_tt_local;
  
  localtime_r(__timer,(tm *)this);
  return (tm *)this;
}

Assistant:

inline std::tm localtime(const std::time_t &time_tt)
{

#ifdef _WIN32
    std::tm tm;
    localtime_s(&tm, &time_tt);
#else
    std::tm tm;
    localtime_r(&time_tt, &tm);
#endif
    return tm;
}